

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupPiPerm(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Gia_Man_t *p_00;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *pGVar9;
  bool bVar10;
  int iPlace1;
  int iPlace0;
  int iLit1;
  int iLit0;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pOne;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  Gia_ManRandom(1);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar7 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar7;
  pcVar7 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar7;
  Gia_ManHashAlloc(p_00);
  pGVar8 = Gia_ManConst0(p);
  pGVar8->Value = 0;
  iLit1 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar10 = false;
    if (iLit1 < iVar1) {
      _iLit0 = Gia_ManCi(p,iLit1);
      bVar10 = _iLit0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    uVar6 = Gia_ManAppendCi(p_00);
    _iLit0->Value = uVar6;
    iLit1 = iLit1 + 1;
  }
  iLit1 = 0;
  while( true ) {
    bVar10 = false;
    if (iLit1 < p->nObjs) {
      _iLit0 = Gia_ManObj(p,iLit1);
      bVar10 = _iLit0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    iVar1 = Gia_ObjIsAnd(_iLit0);
    if (iVar1 != 0) {
      iPlace0 = Gia_ObjFanin0Copy(_iLit0);
      iPlace1 = Gia_ObjFanin1Copy(_iLit0);
      uVar6 = Gia_ManRandom(0);
      uVar2 = Gia_ManCiNum(p);
      uVar3 = Gia_ManRandom(0);
      uVar4 = Gia_ManCiNum(p);
      iVar1 = Abc_Lit2Var(iPlace0);
      iVar5 = Gia_ManCiNum(p);
      if (iVar1 <= iVar5) {
        iVar1 = Abc_LitIsCompl(iPlace0);
        iPlace0 = Abc_Var2Lit(uVar6 % uVar2 + 1,iVar1);
      }
      iVar1 = Abc_Lit2Var(iPlace1);
      iVar5 = Gia_ManCiNum(p);
      if (iVar1 <= iVar5) {
        iVar1 = Abc_LitIsCompl(iPlace1);
        iPlace1 = Abc_Var2Lit(uVar3 % uVar4 + 1,iVar1);
      }
      uVar6 = Gia_ManHashAnd(p_00,iPlace0,iPlace1);
      _iLit0->Value = uVar6;
    }
    iLit1 = iLit1 + 1;
  }
  iLit1 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar10 = false;
    if (iLit1 < iVar1) {
      _iLit0 = Gia_ManCo(p,iLit1);
      bVar10 = _iLit0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    iVar1 = Gia_ObjFanin0Copy(_iLit0);
    uVar6 = Gia_ManAppendCo(p_00,iVar1);
    _iLit0->Value = uVar6;
    iLit1 = iLit1 + 1;
  }
  Gia_ManHashStop(p_00);
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  pGVar9 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar9;
}

Assistant:

Gia_Man_t * Gia_ManDupPiPerm( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pOne;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManRandom(1);
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        int iLit0 = Gia_ObjFanin0Copy(pObj);
        int iLit1 = Gia_ObjFanin1Copy(pObj);
        int iPlace0 = Gia_ManRandom(0) % Gia_ManCiNum(p);
        int iPlace1 = Gia_ManRandom(0) % Gia_ManCiNum(p);
        if ( Abc_Lit2Var(iLit0) <= Gia_ManCiNum(p) )
            iLit0 = Abc_Var2Lit( iPlace0+1, Abc_LitIsCompl(iLit0) );
        if ( Abc_Lit2Var(iLit1) <= Gia_ManCiNum(p) )
            iLit1 = Abc_Var2Lit( iPlace1+1, Abc_LitIsCompl(iLit1) );
        pObj->Value = Gia_ManHashAnd( pNew, iLit0, iLit1 );
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}